

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O0

QStringList * __thiscall QMimeDatabasePrivate::parents(QMimeDatabasePrivate *this,QString *mimeName)

{
  bool bVar1;
  QMimeDatabasePrivate *this_00;
  pointer pQVar2;
  undefined8 in_RDX;
  QMimeDatabasePrivate *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *provider;
  Providers *__range1;
  QStringList *result;
  QString parent;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_ffffffffffffff58;
  QMimeDatabasePrivate *this_01;
  QString *in_stack_ffffffffffffff98;
  __normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->m_defaultMimeType)->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->m_defaultMimeType)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->m_defaultMimeType)->ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x8e4349);
  this_00 = (QMimeDatabasePrivate *)providers(this_01);
  local_10._M_current =
       (unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *)
       &DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *)
       std::
       vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
       ::begin((vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
                *)this_01);
  std::
  vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
  ::end((vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
         *)this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
                             *)this_01,
                            (__normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
    ::operator*(&local_10);
    pQVar2 = std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>::operator->
                       ((unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *)
                        0x8e43f6);
    (*pQVar2->_vptr_QMimeProviderBase[6])(pQVar2,in_RDX,this_01);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
    ::operator++(&local_10);
  }
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x8e4440);
  if (bVar1) {
    fallbackParent(this_00,in_stack_ffffffffffffff98);
    bVar1 = QString::isEmpty((QString *)0x8e4484);
    if (!bVar1) {
      QList<QString>::append((QList<QString> *)this_01,in_stack_ffffffffffffff58);
    }
    QString::~QString((QString *)0x8e44c3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMimeDatabasePrivate::parents(const QString &mimeName)
{
    Q_ASSERT(!mutex.tryLock());
    QStringList result;
    for (const auto &provider : providers())
        provider->addParents(mimeName, result);
    if (result.isEmpty()) {
        const QString parent = fallbackParent(mimeName);
        if (!parent.isEmpty())
            result.append(parent);
    }
    return result;
}